

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  string *psVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  string_view algo;
  bool local_20d2;
  byte local_2039;
  allocator<char> local_1e99;
  string local_1e98;
  string local_1e78 [32];
  string *local_1e58;
  undefined1 local_1e50 [8];
  ostringstream cmCPackLog_msg_12;
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> local_1cc8;
  allocator<char> local_1cb9;
  string local_1cb8;
  cmValue local_1c98;
  cmValue algoSignature;
  undefined1 local_1c70 [8];
  ostringstream cmCPackLog_msg_11;
  allocator<char> local_1af1;
  string local_1af0;
  cmValue local_1ad0;
  allocator<char> local_1ac1;
  string local_1ac0;
  string *local_1aa0;
  string *local_1a98;
  allocator<char> local_1a89;
  string local_1a88;
  cmValue local_1a68;
  cmValue defFileName;
  allocator<char> local_1a39;
  string local_1a38;
  cmXMLSafe local_1a18;
  string local_1a00 [32];
  string *local_19e0;
  undefined1 local_19d8 [8];
  ostringstream cmCPackLog_msg_10;
  undefined1 local_1860 [8];
  string line;
  ostringstream ostr;
  string local_16c8 [32];
  string *local_16a8;
  undefined1 local_16a0 [8];
  ostringstream cmCPackLog_msg_9;
  long local_1528;
  ifstream ifs;
  string local_1320 [32];
  string *local_1300;
  undefined1 local_12f8 [8];
  ostringstream cmCPackLog_msg_8;
  string local_1180 [32];
  string *local_1160;
  undefined1 local_1158 [8];
  ostringstream cmCPackLog_msg_7;
  allocator<char> local_fd9;
  string local_fd8;
  cmValue local_fb8;
  allocator<char> local_fa9;
  string local_fa8;
  cmValue local_f88;
  cmValue descFileName;
  undefined1 local_f60 [8];
  ostringstream cmCPackLog_msg_6;
  allocator<char> local_de1;
  string local_de0;
  allocator<char> local_db9;
  string local_db8;
  string local_d98;
  allocator<char> local_d71;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  allocator<char> local_d21;
  string local_d20;
  allocator<char> local_cf9;
  string local_cf8;
  allocator<char> local_cd1;
  string local_cd0;
  allocator<char> local_ca9;
  string local_ca8;
  allocator<char> local_c81;
  string local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  undefined1 local_c40 [8];
  string outFile;
  allocator<char> local_bf9;
  string local_bf8;
  undefined1 local_bd8 [8];
  string destFile;
  undefined1 local_b98 [8];
  ostringstream cmCPackLog_msg_5;
  allocator<char> local_a19;
  string local_a18;
  cmValue local_9f8;
  cmValue pdir;
  undefined1 local_9d0 [8];
  ostringstream cmCPackLog_msg_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  undefined1 local_838 [8];
  string outName;
  string local_810 [32];
  undefined1 local_7f0 [8];
  ostringstream cmCPackLog_msg_3;
  allocator<char> local_671;
  string local_670;
  cmValue local_650;
  cmValue pfname;
  string topDirectory;
  string local_620;
  cmValue local_600;
  allocator<char> local_5f1;
  string local_5f0;
  cmValue local_5d0;
  cmValue toplevelTag;
  allocator<char> local_591;
  string local_590;
  string *local_570;
  cmAlphaNum local_568;
  undefined1 local_538 [8];
  string tempDirectory;
  ostringstream local_4f8 [8];
  ostringstream cmCPackLog_msg_2;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar5 = std::operator<<((ostream *)local_190,"Create temp directory.");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3c,pcVar6);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"CPACK_SET_DESTDIR",&local_1e1);
  bVar2 = IsOn(this,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  if (bVar2) {
    iVar4 = (*this->_vptr_cmCPackGenerator[0x16])();
    if (iVar4 == 3) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar5 = std::operator<<((ostream *)local_360,"CPACK_SET_DESTDIR is set to ON but the \'");
      poVar5 = std::operator<<(poVar5,(string *)&this->Name);
      poVar5 = std::operator<<(poVar5,"\' generator does NOT support it.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x44,pcVar6);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
      return 0;
    }
    iVar4 = (*this->_vptr_cmCPackGenerator[0x16])();
    if (iVar4 == 2) {
      std::__cxx11::ostringstream::ostringstream(local_4f8);
      poVar5 = std::operator<<((ostream *)local_4f8,"CPACK_SET_DESTDIR is set to ON but it is ");
      poVar5 = std::operator<<(poVar5,"usually a bad idea to do that with \'");
      poVar5 = std::operator<<(poVar5,(string *)&this->Name);
      poVar5 = std::operator<<(poVar5,"\' generator. Use at your own risk.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4b,pcVar6);
      std::__cxx11::string::~string((string *)(tempDirectory.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream(local_4f8);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"CPACK_PACKAGE_DIRECTORY",&local_591);
  local_570 = (string *)GetOption(this,&local_590);
  cmAlphaNum::cmAlphaNum(&local_568,(cmValue)local_570);
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&toplevelTag,"/_CPack_Packages/");
  cmStrCat<>((string *)local_538,&local_568,(cmAlphaNum *)&toplevelTag);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"CPACK_TOPLEVEL_TAG",&local_5f1);
  local_5d0 = GetOption(this,&local_5f0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  bVar2 = cmValue::operator_cast_to_bool(&local_5d0);
  if (bVar2) {
    psVar7 = cmValue::operator*[abi_cxx11_(&local_5d0);
    std::__cxx11::string::operator+=((string *)local_538,(string *)psVar7);
    std::__cxx11::string::operator+=((string *)local_538,"/");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"CPACK_GENERATOR",
             (allocator<char> *)(topDirectory.field_2._M_local_buf + 0xf));
  local_600 = GetOption(this,&local_620);
  psVar7 = cmValue::operator*[abi_cxx11_(&local_600);
  std::__cxx11::string::operator+=((string *)local_538,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)(topDirectory.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&pfname,(string *)local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"CPACK_PACKAGE_FILE_NAME",&local_671);
  local_650 = GetOption(this,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  bVar2 = cmValue::operator_cast_to_bool(&local_650);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7f0);
    poVar5 = std::operator<<((ostream *)local_7f0,"CPACK_PACKAGE_FILE_NAME not specified");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x5b,pcVar6);
    std::__cxx11::string::~string(local_810);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7f0);
    this_local._4_4_ = 0;
    outName.field_2._12_4_ = 1;
    goto LAB_00173c33;
  }
  psVar7 = cmValue::operator_cast_to_string_(&local_650);
  std::__cxx11::string::string((string *)local_838,(string *)psVar7);
  std::operator+(&local_858,"/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838);
  std::__cxx11::string::operator+=((string *)local_538,(string *)&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  iVar4 = (*this->_vptr_cmCPackGenerator[4])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9d0);
    poVar5 = std::operator<<((ostream *)local_9d0,"No output extension specified");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x62,pcVar6);
    std::__cxx11::string::~string((string *)&pdir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9d0);
    this_local._4_4_ = 0;
    outName.field_2._12_4_ = 1;
  }
  else {
    iVar4 = (*this->_vptr_cmCPackGenerator[4])();
    std::__cxx11::string::operator+=((string *)local_838,(char *)CONCAT44(extraout_var_00,iVar4));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a18,"CPACK_PACKAGE_DIRECTORY",&local_a19);
    local_9f8 = GetOption(this,&local_a18);
    std::__cxx11::string::~string((string *)&local_a18);
    std::allocator<char>::~allocator(&local_a19);
    bVar2 = cmValue::operator_cast_to_bool(&local_9f8);
    if (bVar2) {
      psVar7 = cmValue::operator_cast_to_string_(&local_9f8);
      std::__cxx11::string::string((string *)local_bd8,(string *)psVar7);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_bf8,"CPACK_OUTPUT_FILE_PREFIX",&local_bf9);
      SetOptionIfNotSet(this,&local_bf8,(string *)local_bd8);
      std::__cxx11::string::~string((string *)&local_bf8);
      std::allocator<char>::~allocator(&local_bf9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outFile.field_2 + 8),"/",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838)
      ;
      std::__cxx11::string::operator+=
                ((string *)local_bd8,(string *)(outFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(outFile.field_2._M_local_buf + 8));
      std::operator+(&local_c60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pfname,
                     "/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c40,
                     &local_c60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_838)
      ;
      std::__cxx11::string::~string((string *)&local_c60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c80,"CPACK_TOPLEVEL_DIRECTORY",&local_c81);
      SetOptionIfNotSet(this,&local_c80,(string *)&pfname);
      std::__cxx11::string::~string((string *)&local_c80);
      std::allocator<char>::~allocator(&local_c81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ca8,"CPACK_TEMPORARY_DIRECTORY",&local_ca9);
      SetOptionIfNotSet(this,&local_ca8,(string *)local_538);
      std::__cxx11::string::~string((string *)&local_ca8);
      std::allocator<char>::~allocator(&local_ca9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cd0,"CPACK_OUTPUT_FILE_NAME",&local_cd1);
      SetOptionIfNotSet(this,&local_cd0,(string *)local_838);
      std::__cxx11::string::~string((string *)&local_cd0);
      std::allocator<char>::~allocator(&local_cd1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_cf8,"CPACK_OUTPUT_FILE_PATH",&local_cf9);
      SetOptionIfNotSet(this,&local_cf8,(string *)local_bd8);
      std::__cxx11::string::~string((string *)&local_cf8);
      std::allocator<char>::~allocator(&local_cf9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d20,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",&local_d21);
      SetOptionIfNotSet(this,&local_d20,(string *)local_c40);
      std::__cxx11::string::~string((string *)&local_d20);
      std::allocator<char>::~allocator(&local_d21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d48,"CPACK_INSTALL_DIRECTORY",&local_d49);
      iVar4 = (*this->_vptr_cmCPackGenerator[10])();
      SetOptionIfNotSet(this,&local_d48,(char *)CONCAT44(extraout_var_01,iVar4));
      std::__cxx11::string::~string((string *)&local_d48);
      std::allocator<char>::~allocator(&local_d49);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d70,"CPACK_NATIVE_INSTALL_DIRECTORY",&local_d71);
      iVar4 = (*this->_vptr_cmCPackGenerator[10])();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_db8,(char *)CONCAT44(extraout_var_02,iVar4),&local_db9);
      cmsys::SystemTools::ConvertToOutputPath(&local_d98,&local_db8);
      SetOptionIfNotSet(this,&local_d70,&local_d98);
      std::__cxx11::string::~string((string *)&local_d98);
      std::__cxx11::string::~string((string *)&local_db8);
      std::allocator<char>::~allocator(&local_db9);
      std::__cxx11::string::~string((string *)&local_d70);
      std::allocator<char>::~allocator(&local_d71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_de0,"CPACK_TEMPORARY_INSTALL_DIRECTORY",&local_de1);
      SetOptionIfNotSet(this,&local_de0,(string *)local_538);
      std::__cxx11::string::~string((string *)&local_de0);
      std::allocator<char>::~allocator(&local_de1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f60);
      poVar5 = std::operator<<((ostream *)local_f60,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x7d,pcVar6);
      std::__cxx11::string::~string((string *)&descFileName);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fa8,"CPACK_PACKAGE_DESCRIPTION_FILE",&local_fa9);
      local_f88 = GetOption(this,&local_fa8);
      std::__cxx11::string::~string((string *)&local_fa8);
      std::allocator<char>::~allocator(&local_fa9);
      bVar2 = cmValue::operator_cast_to_bool(&local_f88);
      local_2039 = 0;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fd8,"CPACK_PACKAGE_DESCRIPTION",&local_fd9);
        local_fb8 = GetOption(this,&local_fd8);
        bVar2 = cmValue::operator_cast_to_bool(&local_fb8);
        local_2039 = bVar2 ^ 0xff;
        std::__cxx11::string::~string((string *)&local_fd8);
        std::allocator<char>::~allocator(&local_fd9);
      }
      if ((local_2039 & 1) == 0) {
LAB_001736dc:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1af0,"CPACK_PACKAGE_DESCRIPTION",&local_1af1);
        local_1ad0 = GetOption(this,&local_1af0);
        bVar2 = cmValue::operator_cast_to_bool(&local_1ad0);
        std::__cxx11::string::~string((string *)&local_1af0);
        std::allocator<char>::~allocator(&local_1af1);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1cb8,"CPACK_PACKAGE_CHECKSUM",&local_1cb9);
          local_1c98 = GetOption(this,&local_1cb8);
          std::__cxx11::string::~string((string *)&local_1cb8);
          std::allocator<char>::~allocator(&local_1cb9);
          bVar2 = cmValue::operator_cast_to_bool(&local_1c98);
          if (bVar2) {
            psVar7 = cmValue::operator*[abi_cxx11_(&local_1c98);
            pcVar6 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view
                                       ((string *)psVar7);
            algo._M_str = pcVar6;
            algo._M_len = (size_t)&local_1cc8;
            cmCryptoHash::New(algo);
            bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_1cc8);
            std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                      (&local_1cc8);
            if (((bVar2 ^ 0xffU) & 1) != 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e50);
              poVar5 = std::operator<<((ostream *)local_1e50,"Cannot recognize algorithm: ");
              local_1e58 = local_1c98.Value;
              poVar5 = ::operator<<(poVar5,local_1c98);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                              ,0xab,pcVar6);
              std::__cxx11::string::~string(local_1e78);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e50);
              this_local._4_4_ = 0;
              outName.field_2._12_4_ = 1;
              goto LAB_00173be3;
            }
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e98,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",&local_1e99);
          SetOptionIfNotSet(this,&local_1e98,"1");
          std::__cxx11::string::~string((string *)&local_1e98);
          std::allocator<char>::~allocator(&local_1e99);
          this_local._4_4_ = 1;
          outName.field_2._12_4_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c70);
          poVar5 = std::operator<<((ostream *)local_1c70,
                                   "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                                  );
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0xa3,pcVar6);
          std::__cxx11::string::~string((string *)&algoSignature);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c70);
          this_local._4_4_ = 0;
          outName.field_2._12_4_ = 1;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1158);
        poVar5 = std::operator<<((ostream *)local_1158,"Look for: ");
        local_1160 = local_f88.Value;
        poVar5 = ::operator<<(poVar5,local_f88);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x81,pcVar6);
        std::__cxx11::string::~string(local_1180);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1158);
        psVar7 = cmValue::operator_cast_to_string_(&local_f88);
        bVar2 = cmsys::SystemTools::FileExists(psVar7);
        if (bVar2) {
          cmValue::operator->[abi_cxx11_(&local_f88);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::ifstream::ifstream(&local_1528,pcVar6,_S_in);
          bVar3 = std::ios::operator!((ios *)((long)&local_1528 + *(long *)(local_1528 + -0x18)));
          if ((bVar3 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)(line.field_2._M_local_buf + 8));
            std::__cxx11::string::string((string *)local_1860);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_19d8);
            poVar5 = std::operator<<((ostream *)local_19d8,"Read description file: ");
            local_19e0 = local_f88.Value;
            poVar5 = ::operator<<(poVar5,local_f88);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x93,pcVar6);
            std::__cxx11::string::~string(local_1a00);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_19d8);
            while( true ) {
              bVar2 = std::ios::operator_cast_to_bool
                                ((ios *)((long)&local_1528 + *(long *)(local_1528 + -0x18)));
              local_20d2 = false;
              if (bVar2) {
                local_20d2 = cmsys::SystemTools::GetLineFromStream
                                       ((istream *)&local_1528,(string *)local_1860,(bool *)0x0,
                                        0xffffffffffffffff);
              }
              if (local_20d2 == false) break;
              cmXMLSafe::cmXMLSafe(&local_1a18,(string *)local_1860);
              poVar5 = ::operator<<((ostream *)((long)&line.field_2 + 8),&local_1a18);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a38,"CPACK_PACKAGE_DESCRIPTION",&local_1a39);
            std::__cxx11::ostringstream::str();
            SetOption(this,&local_1a38,(string *)&defFileName);
            std::__cxx11::string::~string((string *)&defFileName);
            std::__cxx11::string::~string((string *)&local_1a38);
            std::allocator<char>::~allocator(&local_1a39);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1a88,"CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE",&local_1a89);
            local_1a68 = GetOption(this,&local_1a88);
            std::__cxx11::string::~string((string *)&local_1a88);
            std::allocator<char>::~allocator(&local_1a89);
            bVar2 = cmValue::operator_cast_to_bool(&local_1a68);
            if (bVar2) {
              local_1a98 = local_1a68.Value;
              local_1aa0 = local_f88.Value;
              bVar2 = ::operator==(local_1a68,local_f88);
              if (bVar2) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1ac0,"CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE",
                           &local_1ac1);
                SetOption(this,&local_1ac0,"ON");
                std::__cxx11::string::~string((string *)&local_1ac0);
                std::allocator<char>::~allocator(&local_1ac1);
              }
            }
            std::__cxx11::string::~string((string *)local_1860);
            std::__cxx11::ostringstream::~ostringstream
                      ((ostringstream *)(line.field_2._M_local_buf + 8));
            outName.field_2._12_4_ = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_16a0);
            poVar5 = std::operator<<((ostream *)local_16a0,"Cannot open description file name: ");
            local_16a8 = local_f88.Value;
            poVar5 = ::operator<<(poVar5,local_f88);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x8c,pcVar6);
            std::__cxx11::string::~string(local_16c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_16a0);
            this_local._4_4_ = 0;
            outName.field_2._12_4_ = 1;
          }
          std::ifstream::~ifstream(&local_1528);
          if (outName.field_2._12_4_ == 0) goto LAB_001736dc;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12f8);
          poVar5 = std::operator<<((ostream *)local_12f8,"Cannot find description file name: [");
          local_1300 = local_f88.Value;
          poVar5 = ::operator<<(poVar5,local_f88);
          poVar5 = std::operator<<(poVar5,"]");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x85,pcVar6);
          std::__cxx11::string::~string(local_1320);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12f8);
          this_local._4_4_ = 0;
          outName.field_2._12_4_ = 1;
        }
      }
LAB_00173be3:
      std::__cxx11::string::~string((string *)local_c40);
      std::__cxx11::string::~string((string *)local_bd8);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b98);
      poVar5 = std::operator<<((ostream *)local_b98,"CPACK_PACKAGE_DIRECTORY not specified");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x69,pcVar6);
      std::__cxx11::string::~string((string *)(destFile.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b98);
      this_local._4_4_ = 0;
      outName.field_2._12_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_838);
LAB_00173c33:
  std::__cxx11::string::~string((string *)&pfname);
  std::__cxx11::string::~string((string *)local_538);
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (this->IsOn("CPACK_SET_DESTDIR")) {
    if (SETDESTDIR_UNSUPPORTED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "CPACK_SET_DESTDIR is set to ON but the '"
                      << this->Name << "' generator does NOT support it."
                      << std::endl);
      return 0;
    }
    if (SETDESTDIR_SHOULD_NOT_BE_USED == this->SupportsSetDestdir()) {
      cmCPackLogger(cmCPackLog::LOG_WARNING,
                    "CPACK_SET_DESTDIR is set to ON but it is "
                      << "usually a bad idea to do that with '" << this->Name
                      << "' generator. Use at your own risk." << std::endl);
    }
  }

  std::string tempDirectory =
    cmStrCat(this->GetOption("CPACK_PACKAGE_DIRECTORY"), "/_CPack_Packages/");
  cmValue toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if (toplevelTag) {
    tempDirectory += *toplevelTag;
    tempDirectory += "/";
  }
  tempDirectory += *this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  cmValue pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if (!pfname) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
  }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if (!this->GetOutputExtension()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
  }
  outName += this->GetOutputExtension();
  cmValue pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if (!pdir) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
  }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile);
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName);
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile);
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME", outFile);
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet(
    "CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()));
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY", tempDirectory);

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  cmValue descFileName = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if (descFileName && !this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if (!cmSystemTools::FileExists(descFileName)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                      << descFileName << "]" << std::endl);
      return 0;
    }
    cmsys::ifstream ifs(descFileName->c_str());
    if (!ifs) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot open description file name: " << descFileName
                                                          << std::endl);
      return 0;
    }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Read description file: " << descFileName << std::endl);
    while (ifs && cmSystemTools::GetLineFromStream(ifs, line)) {
      ostr << cmXMLSafe(line) << std::endl;
    }
    this->SetOption("CPACK_PACKAGE_DESCRIPTION", ostr.str());
    cmValue defFileName =
      this->GetOption("CPACK_DEFAULT_PACKAGE_DESCRIPTION_FILE");
    if (defFileName && (defFileName == descFileName)) {
      this->SetOption("CPACK_USED_DEFAULT_PACKAGE_DESCRIPTION_FILE", "ON");
    }
  }
  if (!this->GetOption("CPACK_PACKAGE_DESCRIPTION")) {
    cmCPackLogger(
      cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
        << std::endl);
    return 0;
  }
  cmValue algoSignature = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  if (algoSignature) {
    if (!cmCryptoHash::New(*algoSignature)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot recognize algorithm: " << algoSignature
                                                   << std::endl);
      return 0;
    }
  }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}